

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::JoinDefines
          (cmLocalGenerator *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *defines,string *definesString,string *lang)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  cmState *this_00;
  string local_148;
  string local_128;
  string local_108 [32];
  long local_e8;
  size_type eq;
  char *c;
  string def;
  string *define;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  char *itemSeparator;
  char *df;
  undefined1 local_80 [8];
  string defineFlagVar;
  allocator<char> local_49;
  string local_48 [8];
  string dflag;
  string *lang_local;
  string *definesString_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *defines_local;
  cmLocalGenerator *this_local;
  
  dflag.field_2._8_8_ = lang;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"-D",&local_49);
  std::allocator<char>::~allocator(&local_49);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_80,"CMAKE_",(allocator<char> *)((long)&df + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&df + 7));
    std::__cxx11::string::operator+=((string *)local_80,(string *)dflag.field_2._8_8_);
    std::__cxx11::string::operator+=((string *)local_80,"_DEFINE_FLAG");
    pcVar4 = cmMakefile::GetDefinition(this->Makefile,(string *)local_80);
    if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
      std::__cxx11::string::operator=(local_48,pcVar4);
    }
    std::__cxx11::string::~string((string *)local_80);
  }
  bVar1 = std::__cxx11::string::empty();
  __range1 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x8afc0a;
  if ((bVar1 & 1) != 0) {
    __range1 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x8d3ee0;
  }
  __end1 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(defines);
  define = (string *)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(defines);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&define), bVar2) {
    def.field_2._8_8_ =
         std::
         _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator*(&__end1);
    std::__cxx11::string::string((string *)&c,local_48);
    this_00 = GetState(this);
    bVar2 = cmState::UseWatcomWMake(this_00);
    if (bVar2) {
      for (eq = std::__cxx11::string::c_str(); *(char *)eq != '\0'; eq = eq + 1) {
        if ((*(char *)eq == '$') || (*(char *)eq == '#')) {
          std::__cxx11::string::operator+=((string *)&c,'$');
        }
        std::__cxx11::string::operator+=((string *)&c,*(char *)eq);
      }
    }
    else {
      local_e8 = std::__cxx11::string::find((char)def.field_2._8_8_,0x3d);
      std::__cxx11::string::substr((ulong)local_108,def.field_2._8_8_);
      std::__cxx11::string::operator+=((string *)&c,local_108);
      std::__cxx11::string::~string(local_108);
      if (local_e8 != -1) {
        std::__cxx11::string::operator+=((string *)&c,"=");
        std::__cxx11::string::substr((ulong)&local_148,def.field_2._8_8_);
        cmOutputConverter::EscapeForShell
                  (&local_128,&this->super_cmOutputConverter,&local_148,true,false,false);
        std::__cxx11::string::operator+=((string *)&c,(string *)&local_128);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_148);
      }
    }
    std::__cxx11::string::operator+=((string *)definesString,(char *)__range1);
    __range1 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x8afc0a;
    std::__cxx11::string::operator+=((string *)definesString,(string *)&c);
    std::__cxx11::string::~string((string *)&c);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void cmLocalGenerator::JoinDefines(const std::set<std::string>& defines,
                                   std::string& definesString,
                                   const std::string& lang)
{
  // Lookup the define flag for the current language.
  std::string dflag = "-D";
  if (!lang.empty()) {
    std::string defineFlagVar = "CMAKE_";
    defineFlagVar += lang;
    defineFlagVar += "_DEFINE_FLAG";
    const char* df = this->Makefile->GetDefinition(defineFlagVar);
    if (df && *df) {
      dflag = df;
    }
  }
  const char* itemSeparator = definesString.empty() ? "" : " ";
  for (std::string const& define : defines) {
    // Append the definition with proper escaping.
    std::string def = dflag;
    if (this->GetState()->UseWatcomWMake()) {
      // The Watcom compiler does its own command line parsing instead
      // of using the windows shell rules.  Definitions are one of
      //   -DNAME
      //   -DNAME=<cpp-token>
      //   -DNAME="c-string with spaces and other characters(?@#$)"
      //
      // Watcom will properly parse each of these cases from the
      // command line without any escapes.  However we still have to
      // get the '$' and '#' characters through WMake as '$$' and
      // '$#'.
      for (const char* c = define.c_str(); *c; ++c) {
        if (*c == '$' || *c == '#') {
          def += '$';
        }
        def += *c;
      }
    } else {
      // Make the definition appear properly on the command line.  Use
      // -DNAME="value" instead of -D"NAME=value" for historical reasons.
      std::string::size_type eq = define.find('=');
      def += define.substr(0, eq);
      if (eq != std::string::npos) {
        def += "=";
        def += this->EscapeForShell(define.substr(eq + 1), true);
      }
    }
    definesString += itemSeparator;
    itemSeparator = " ";
    definesString += def;
  }
}